

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,double,double,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool,true,false>
               (double *ldata,double *rdata,double *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  double dVar1;
  double dVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  double *pdVar9;
  double *pdVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  ulong uVar13;
  ulong uVar14;
  idx_t idx_in_entry_1;
  ulong uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double lentry;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  double *local_80;
  idx_t local_78;
  double *local_70;
  double *local_68;
  idx_t local_60;
  ulong local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  double local_48;
  ulong local_40;
  double *local_38;
  
  local_70 = rdata;
  local_68 = ldata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar1 = *ldata;
      uVar16 = 0;
      do {
        dVar2 = local_70[uVar16];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          dVar2 = fmod(dVar1,dVar2);
          uVar17 = SUB84(dVar2,0);
          uVar18 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        else {
          _Var12._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_78);
            p_Var8 = p_Stack_90;
            peVar7 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar7;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var8;
            if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var12._M_head_impl;
          }
          bVar6 = (byte)uVar16 & 0x3f;
          _Var12._M_head_impl[uVar16 >> 6] =
               _Var12._M_head_impl[uVar16 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
          uVar17 = SUB84(dVar1,0);
          uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        result_data[uVar16] = (double)CONCAT44(uVar18,uVar17);
        uVar16 = uVar16 + 1;
      } while (count != uVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    local_50 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_40 = 0;
    uVar16 = 0;
    local_80 = result_data;
    local_60 = count;
    do {
      pdVar10 = local_70;
      pdVar9 = local_80;
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar13 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar13 = count;
        }
LAB_014b3fde:
        uVar14 = uVar16;
        if (uVar16 < uVar13) {
          dVar1 = *local_68;
          do {
            dVar2 = pdVar10[uVar16];
            if ((dVar2 != 0.0) || (NAN(dVar2))) {
              dVar2 = fmod(dVar1,dVar2);
              uVar17 = SUB84(dVar2,0);
              uVar18 = (undefined4)((ulong)dVar2 >> 0x20);
            }
            else {
              _Var12._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
              ;
              if (_Var12._M_head_impl == (unsigned_long *)0x0) {
                local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_98,&local_78);
                p_Var8 = p_Stack_90;
                peVar7 = local_98;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar7;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var8;
                if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
                   p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                }
                pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_50);
                _Var12._M_head_impl =
                     (pTVar11->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var12._M_head_impl;
              }
              bVar6 = (byte)uVar16 & 0x3f;
              _Var12._M_head_impl[uVar16 >> 6] =
                   _Var12._M_head_impl[uVar16 >> 6] &
                   (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              uVar17 = SUB84(dVar1,0);
              uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
            }
            result_data[uVar16] = (double)CONCAT44(uVar18,uVar17);
            uVar16 = uVar16 + 1;
            uVar14 = uVar13;
          } while (uVar13 != uVar16);
        }
      }
      else {
        uVar4 = puVar3[local_40];
        uVar13 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar13 = count;
        }
        uVar14 = uVar13;
        result_data = local_80;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_014b3fde;
          uVar14 = uVar16;
          count = local_60;
          if (uVar16 < uVar13) {
            local_38 = local_70 + uVar16;
            uVar15 = 0;
            do {
              if ((uVar4 >> (uVar15 & 0x3f) & 1) != 0) {
                dVar1 = *local_68;
                uVar17 = SUB84(dVar1,0);
                uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
                dVar2 = local_38[uVar15];
                if ((dVar2 != 0.0) || (NAN(dVar2))) {
                  dVar1 = fmod(dVar1,dVar2);
                  uVar17 = SUB84(dVar1,0);
                  uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
                }
                else {
                  _Var12._M_head_impl =
                       (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                  if (_Var12._M_head_impl == (unsigned_long *)0x0) {
                    local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    local_48 = dVar1;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_78);
                    p_Var8 = p_Stack_90;
                    peVar7 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar7;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var8;
                    if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
                       p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_50);
                    _Var12._M_head_impl =
                         (pTVar11->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var12._M_head_impl;
                    uVar17 = SUB84(local_48,0);
                    uVar18 = (undefined4)((ulong)local_48 >> 0x20);
                  }
                  bVar6 = (byte)(uVar16 + uVar15) & 0x3f;
                  _Var12._M_head_impl[uVar16 + uVar15 >> 6] =
                       _Var12._M_head_impl[uVar16 + uVar15 >> 6] &
                       (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                }
                pdVar9[uVar16 + uVar15] = (double)CONCAT44(uVar18,uVar17);
              }
              uVar15 = uVar15 + 1;
              uVar14 = uVar13;
              count = local_60;
              result_data = local_80;
            } while (uVar13 - uVar16 != uVar15);
          }
        }
      }
      local_40 = local_40 + 1;
      uVar16 = uVar14;
    } while (local_40 != local_58);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}